

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O3

bool SpeedAESBlock(string *name,uint bits,string *selected)

{
  pointer pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long in_RCX;
  TimeResults results;
  TimeResults results_1;
  uint8_t block [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint local_1ec;
  string local_1e8;
  TimeResults local_1c8;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined1 local_128 [248];
  
  local_1ec = bits;
  if ((in_RCX != 0) &&
     (lVar5 = std::__cxx11::string::find((char *)name,(ulong)selected,0), lVar5 == -1)) {
    return true;
  }
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:610:41)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:610:41)>
              ::_M_manager;
  local_158._M_unused._M_object = &local_1ec;
  bVar3 = TimeFunctionParallel((TimeResults *)&local_1e8,(function<bool_()> *)&local_158);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  if (bVar3) {
    pcVar2 = local_128 + 0x10;
    pcVar1 = (name->_M_dataplus)._M_p;
    local_128._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar1,pcVar1 + name->_M_string_length);
    std::__cxx11::string::append((char *)local_128);
    TimeResults::Print((TimeResults *)&local_1e8,(string *)local_128);
    if ((pointer)local_128._0_8_ != pcVar2) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    iVar4 = AES_set_encrypt_key("",local_1ec,(AES_KEY *)local_128);
    if (iVar4 == 0) {
      local_138 = 0;
      uStack_130 = 0;
      local_160 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:627:41)>
                  ::_M_invoke;
      local_168 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:627:41)>
                  ::_M_manager;
      local_178._M_unused._M_object = &local_138;
      local_178._8_8_ = (AES_KEY *)local_128;
      bVar3 = TimeFunctionParallel(&local_1c8,(function<bool_()> *)&local_178);
      if (local_168 != (code *)0x0) {
        (*local_168)(&local_178,&local_178,__destroy_functor);
      }
      if (bVar3) {
        pcVar1 = (name->_M_dataplus)._M_p;
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar1,pcVar1 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_1e8);
        TimeResults::Print(&local_1c8,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        local_198._8_8_ = 0;
        local_180 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:639:41)>
                    ::_M_invoke;
        local_188 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:639:41)>
                    ::_M_manager;
        local_198._M_unused._M_object = &local_1ec;
        bVar3 = TimeFunctionParallel((TimeResults *)&local_1e8,(function<bool_()> *)&local_198);
        if (local_188 != (code *)0x0) {
          (*local_188)(&local_198,&local_198,__destroy_functor);
        }
        if (bVar3) {
          pcVar1 = (name->_M_dataplus)._M_p;
          local_128._0_8_ = pcVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_128,pcVar1,pcVar1 + name->_M_string_length);
          std::__cxx11::string::append((char *)local_128);
          TimeResults::Print((TimeResults *)&local_1e8,(string *)local_128);
          if ((pointer)local_128._0_8_ != pcVar2) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
          iVar4 = AES_set_decrypt_key("",local_1ec,(AES_KEY *)local_128);
          if (iVar4 == 0) {
            local_138 = 0;
            uStack_130 = 0;
            local_1a0 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:656:41)>
                        ::_M_invoke;
            local_1a8 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:656:41)>
                        ::_M_manager;
            local_1b8._M_unused._M_object = &local_138;
            local_1b8._8_8_ = (AES_KEY *)local_128;
            bVar3 = TimeFunctionParallel(&local_1c8,(function<bool_()> *)&local_1b8);
            if (local_1a8 != (code *)0x0) {
              (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
            }
            if (bVar3) {
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              pcVar2 = (name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e8,pcVar2,pcVar2 + name->_M_string_length);
              std::__cxx11::string::append((char *)&local_1e8);
              TimeResults::Print(&local_1c8,&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p == &local_1e8.field_2) {
                return bVar3;
              }
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
              return bVar3;
            }
            SpeedAESBlock();
            return bVar3;
          }
        }
        else {
          SpeedAESBlock();
        }
      }
      else {
        fwrite("AES_encrypt failed.\n",0x14,1,_stderr);
      }
    }
  }
  else {
    SpeedAESBlock();
  }
  return false;
}

Assistant:

static bool SpeedAESBlock(const std::string &name, unsigned bits,
                          const std::string &selected) {
  if (!selected.empty() && name.find(selected) == std::string::npos) {
    return true;
  }

  static const uint8_t kZero[32] = {0};

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_encrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_encrypt_key failed.\n");
      return false;
    }
    results.Print(name + " encrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_encrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_encrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_encrypt failed.\n");
      return false;
    }
    results.Print(name + " encrypt");
  }

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_decrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_decrypt_key failed.\n");
      return false;
    }
    results.Print(name + " decrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_decrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_decrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_decrypt failed.\n");
      return false;
    }
    results.Print(name + " decrypt");
  }

  return true;
}